

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O1

int computeHostNumPhysicalCores(void)

{
  pair<int,_int> pVar1;
  byte bVar2;
  bool bVar3;
  undefined8 uVar4;
  raw_ostream *prVar5;
  long *plVar6;
  llvm *this;
  size_t in_RCX;
  undefined4 uVar7;
  int iVar8;
  StringRef *this_00;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  longlong *Result;
  pair<int,_int> pVar12;
  long lVar13;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Str_02;
  StringRef Str_03;
  StringRef SVar14;
  StringRef SVar15;
  StringRef Separator;
  longlong LLVal;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> Text;
  pair<llvm::StringRef,_llvm::StringRef> Data;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> UniqueItems;
  SmallVector<llvm::StringRef,_8U> strs;
  pair<int,_int> local_250;
  llvm *local_248;
  pair<int,_int> local_240;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_238;
  byte local_228;
  pair<llvm::StringRef,_llvm::StringRef> local_220;
  Child local_200;
  void *local_1f8;
  Child local_1f0 [32];
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_f0;
  SmallVectorImpl<llvm::StringRef> local_c0;
  StringRef local_b0 [8];
  
  llvm::Twine::Twine((Twine *)&local_200,"/proc/cpuinfo");
  llvm::MemoryBuffer::getFileAsStream
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_238.TStorage,(Twine *)&local_200);
  bVar2 = local_228;
  if ((local_228 & 1) == 0) {
    uVar7 = 0;
    uVar4 = std::_V2::system_category();
  }
  else {
    uVar4 = local_238._8_8_;
    uVar7 = local_238._0_4_;
  }
  if (uVar7 == 0) {
    local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_b0;
    local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
    local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 8;
    if ((bVar2 & 1) != 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                   );
    }
    local_200 = (Child)((Child *)
                       ((long)local_238.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))->
                       twine;
    local_1f8 = (void *)(*(long *)((long)local_238.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer
                                  + 0x10) - (long)local_200);
    uVar10 = 0xffffffff;
    Result = (longlong *)0xffffffff;
    SVar14.Length = 1;
    SVar14.Data = "\n";
    llvm::StringRef::split((StringRef *)&local_200,&local_c0,SVar14,-1,false);
    local_200.twine = (Twine *)local_1f0;
    local_1f8 = (void *)0x2000000000;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f0._M_impl.super__Rb_tree_header._M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) != 0) {
      lVar13 = (local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff) << 4;
      pVar12.first = -1;
      pVar12.second = 0;
      this_00 = (StringRef *)
                local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      do {
        SVar15.Length = 6;
        SVar15.Data = " \t\n\v\f\r";
        SVar14 = llvm::StringRef::trim(this_00,SVar15);
        plVar6 = (long *)SVar14.Data;
        *this_00 = SVar14;
        if (((10 < SVar14.Length) &&
            (*(long *)((long)plVar6 + 3) == 0x6469206c61636973 && *plVar6 == 0x6c61636973796870)) ||
           ((6 < SVar14.Length &&
            (*(int *)((long)plVar6 + 3) == 0x64692065 && (int)*plVar6 == 0x65726f63)))) {
          local_250.first._0_1_ = 0x3a;
          Separator.Length = 1;
          Separator.Data = (char *)&local_250;
          local_240 = pVar12;
          llvm::StringRef::split(&local_220,this_00,Separator);
          Chars.Length = 6;
          Chars.Data = " \t\n\v\f\r";
          SVar14 = llvm::StringRef::trim(&local_220.first,Chars);
          plVar6 = (long *)SVar14.Data;
          Chars_00.Length = 6;
          Chars_00.Data = " \t\n\v\f\r";
          SVar15 = llvm::StringRef::trim(&local_220.second,Chars_00);
          this = (llvm *)SVar15.Data;
          uVar11 = uVar10;
          if ((SVar14.Length == 0xb) &&
             (*(long *)((long)plVar6 + 3) == 0x6469206c61636973 && *plVar6 == 0x6c61636973796870)) {
            if (uVar10 != 0xffffffff) {
              __assert_fail("CurPhysicalId == -1 && \"Expected a core id before seeing another physical id\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                            ,0x458,"int computeHostNumPhysicalCores()");
            }
            Str_02.Length = 10;
            Str_02.Data = (char *)SVar15.Length;
            local_248 = this;
            bVar3 = llvm::getAsSignedInteger(this,Str_02,(uint)&local_250,Result);
            uVar11 = local_250.first;
            if ((pair<int,_int>)(long)local_250.first != local_250) {
              uVar11 = uVar10;
            }
            this = local_248;
            if (bVar3) {
              uVar11 = uVar10;
            }
          }
          pVar12 = local_240;
          if ((SVar14.Length == 7) &&
             (*(int *)((long)plVar6 + 3) == 0x64692065 && (int)*plVar6 == 0x65726f63)) {
            if (local_240.first != -1) {
              __assert_fail("CurCoreId == -1 && \"Expected a physical id before seeing another core id\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                            ,0x45d,"int computeHostNumPhysicalCores()");
            }
            Str_03.Length = 10;
            Str_03.Data = (char *)SVar15.Length;
            bVar3 = llvm::getAsSignedInteger(this,Str_03,(uint)&local_250,Result);
            pVar1 = local_250;
            if ((pair<int,_int>)(long)local_250.first != local_250) {
              pVar1 = pVar12;
            }
            uVar10 = pVar1.first;
            if (bVar3) {
              uVar10 = 0xffffffff;
            }
            pVar12.second = 0;
            pVar12.first = uVar10;
          }
          uVar10 = uVar11;
          if ((uVar11 != 0xffffffff) && (pVar12.first != -1)) {
            local_250 = (pair<int,_int>)((ulong)uVar11 | (long)pVar12 << 0x20);
            llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
                      ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)
                       &local_200,&local_250);
            pVar12.first = -1;
            pVar12.second = 0;
            uVar10 = 0xffffffff;
          }
        }
        this_00 = this_00 + 1;
        lVar13 = lVar13 + -0x10;
      } while (lVar13 != 0);
    }
    sVar9 = local_f0._M_impl.super__Rb_tree_header._M_node_count;
    if (local_f0._M_impl.super__Rb_tree_header._M_node_count == 0) {
      sVar9 = (ulong)local_1f8 & 0xffffffff;
    }
    iVar8 = (int)sVar9;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::_M_erase(&local_f0,(_Link_type)local_f0._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (&(local_200.twine)->LHS != local_1f0) {
      free(local_200.twine);
    }
    if ((StringRef *)
        local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
        local_b0) {
      free(local_c0.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
    }
  }
  else {
    prVar5 = llvm::errs();
    Str.Length = 0xb;
    Str.Data = "Can\'t read ";
    prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
    Str_00.Length = 0xf;
    Str_00.Data = "/proc/cpuinfo: ";
    prVar5 = llvm::raw_ostream::operator<<(prVar5,Str_00);
    (**(code **)(*(long *)uVar4 + 0x20))(&local_200,uVar4,uVar7);
    prVar5 = (raw_ostream *)llvm::raw_ostream::write(prVar5,local_200.decI,local_1f8,in_RCX);
    Str_01.Length = 1;
    Str_01.Data = "\n";
    llvm::raw_ostream::operator<<(prVar5,Str_01);
    if (&(local_200.twine)->LHS != local_1f0) {
      operator_delete(local_200.twine,(ulong)((long)&(local_1f0[0].twine)->LHS + 1));
    }
    iVar8 = -1;
  }
  if (((local_228 & 1) == 0) &&
     ((AlignedCharArray<8UL,_8UL>)local_238.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
      (AlignedCharArray<8UL,_8UL>)0x0)) {
    (**(code **)(*(long *)local_238.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return iVar8;
}

Assistant:

static int computeHostNumPhysicalCores() {
  // Read /proc/cpuinfo as a stream (until EOF reached). It cannot be
  // mmapped because it appears to have 0 size.
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>> Text =
      llvm::MemoryBuffer::getFileAsStream("/proc/cpuinfo");
  if (std::error_code EC = Text.getError()) {
    llvm::errs() << "Can't read "
                 << "/proc/cpuinfo: " << EC.message() << "\n";
    return -1;
  }
  SmallVector<StringRef, 8> strs;
  (*Text)->getBuffer().split(strs, "\n", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
  int CurPhysicalId = -1;
  int CurCoreId = -1;
  SmallSet<std::pair<int, int>, 32> UniqueItems;
  for (auto &Line : strs) {
    Line = Line.trim();
    if (!Line.startswith("physical id") && !Line.startswith("core id"))
      continue;
    std::pair<StringRef, StringRef> Data = Line.split(':');
    auto Name = Data.first.trim();
    auto Val = Data.second.trim();
    if (Name == "physical id") {
      assert(CurPhysicalId == -1 &&
             "Expected a core id before seeing another physical id");
      Val.getAsInteger(10, CurPhysicalId);
    }
    if (Name == "core id") {
      assert(CurCoreId == -1 &&
             "Expected a physical id before seeing another core id");
      Val.getAsInteger(10, CurCoreId);
    }
    if (CurPhysicalId != -1 && CurCoreId != -1) {
      UniqueItems.insert(std::make_pair(CurPhysicalId, CurCoreId));
      CurPhysicalId = -1;
      CurCoreId = -1;
    }
  }
  return UniqueItems.size();
}